

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestPoly1305
          (CryptoTest *this,string *hexmessage,string *hexkey,string *hextag)

{
  long lVar1;
  int iVar2;
  unsigned_long bytes;
  size_t bytes_00;
  pointer m_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  string *psVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  const_string msg;
  const_string msg_00;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Span<std::byte> out;
  const_string file;
  Span<const_unsigned_char> s;
  Span<const_std::byte> key_01;
  Span<std::byte> out_00;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  vector<std::byte,_std::allocator<std::byte>_> tagres;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  string local_d0;
  undefined1 local_b0 [32];
  Poly1305 poly1305;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  ParseHex<std::byte>(&key,hex_str);
  hex_str_00._M_str = (hexmessage->_M_dataplus)._M_p;
  hex_str_00._M_len = hexmessage->_M_string_length;
  ParseHex<std::byte>(&m,hex_str_00);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&tagres,0x10,(allocator_type *)&poly1305);
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  Poly1305::Poly1305((Poly1305 *)&poly1305.m_ctx,key_00);
  poly1305_donna::poly1305_update
            (&poly1305.m_ctx,
             m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  out.m_size = (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
  out.m_data = tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
  Poly1305::Finalize((Poly1305 *)&poly1305.m_ctx,out);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xeb;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  poly1305.m_ctx.r[2]._0_1_ = 0;
  poly1305.m_ctx.r._0_8_ = &PTR__lazy_ostream_01139f30;
  poly1305.m_ctx._16_8_ = boost::unit_test::lazy_ostream::inst;
  poly1305.m_ctx.h._4_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_140 = "";
  s.m_size = (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_((string *)local_b0,s);
  pvVar3 = (iterator)0x2;
  psVar4 = (string *)local_b0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&poly1305,&local_148,0xeb,1,2,psVar4,"HexStr(tagres)",hextag,"hextag");
  std::__cxx11::string::~string((string *)local_b0);
  for (iVar6 = 0; iVar6 != 10; iVar6 = iVar6 + 1) {
    for (iVar2 = 0;
        m_00 = m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start, iVar2 != 10; iVar2 = iVar2 + 1) {
      bytes_00 = (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
      key_01.m_size =
           (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      key_01.m_data =
           key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      Poly1305::Poly1305((Poly1305 *)&poly1305.m_ctx,key_01);
      iVar5 = iVar6;
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        bytes = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,bytes_00 + 1);
        poly1305_donna::poly1305_update(&poly1305.m_ctx,m_00,bytes);
        m_00 = m_00 + bytes;
        bytes_00 = bytes_00 - bytes;
      }
      local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
      std::vector<std::byte,_std::allocator<std::byte>_>::_M_fill_assign(&tagres,0x10,local_b0);
      poly1305_donna::poly1305_update(&poly1305.m_ctx,m_00,bytes_00);
      out_00.m_size =
           (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      out_00.m_data =
           tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      Poly1305::Finalize((Poly1305 *)&poly1305.m_ctx,out_00);
      local_158 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_150 = "";
      local_168 = &boost::unit_test::basic_cstring<char_const>::null;
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = (iterator)psVar4;
      msg_00.m_begin = pvVar3;
      file_00.m_end = (iterator)0xf9;
      file_00.m_begin = (iterator)&local_158;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
                 msg_00);
      local_b0[8] = 0;
      local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
      local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_b0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_178 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_170 = "";
      s_00.m_size = (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start;
      s_00.m_data = tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      HexStr_abi_cxx11_(&local_d0,s_00);
      pvVar3 = (iterator)0x2;
      psVar4 = &local_d0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_b0,&local_178,0xf9,1,2,&local_d0,"HexStr(tagres)",hextag,"hextag");
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&tagres.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&m.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestPoly1305(const std::string &hexmessage, const std::string &hexkey, const std::string& hextag)
{
    auto key = ParseHex<std::byte>(hexkey);
    auto m = ParseHex<std::byte>(hexmessage);
    std::vector<std::byte> tagres(Poly1305::TAGLEN);
    Poly1305{key}.Update(m).Finalize(tagres);
    BOOST_CHECK_EQUAL(HexStr(tagres), hextag);

    // Test incremental interface
    for (int splits = 0; splits < 10; ++splits) {
        for (int iter = 0; iter < 10; ++iter) {
            auto data = Span{m};
            Poly1305 poly1305{key};
            for (int chunk = 0; chunk < splits; ++chunk) {
                size_t now = m_rng.randrange(data.size() + 1);
                poly1305.Update(data.first(now));
                data = data.subspan(now);
            }
            tagres.assign(Poly1305::TAGLEN, std::byte{});
            poly1305.Update(data).Finalize(tagres);
            BOOST_CHECK_EQUAL(HexStr(tagres), hextag);
        }
    }
}